

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

void __thiscall Shell::parseModuleAssertion(Shell *this,Element *s)

{
  byte bVar1;
  Element *pEVar2;
  Name *pNVar3;
  char *extraout_RDX;
  anon_class_16_2_42fb14a4 visitor;
  anon_class_16_2_42fb14a4 visitor_00;
  anon_class_16_2_4322515e visitor_01;
  anon_class_16_2_42fb14a4 visitor_02;
  SExpressionWasmBuilder local_760 [608];
  undefined1 local_500 [8];
  Module wasm;
  anon_class_16_2_42fb14a4 reportUnknownImport;
  __uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  local_30;
  unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  builder;
  bool invalid;
  
  ::wasm::Module::Module((Module *)local_500);
  wasm.debugInfoFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1efff;
  local_30._M_t.
  super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl =
       (tuple<wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>)
       (_Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
        )0x0;
  ::wasm::Element::operator[]((uint)s);
  ::wasm::Element::str();
  builder._M_t.
  super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._7_1_ = 0;
  pEVar2 = (Element *)::wasm::Element::operator[]((uint)s);
  ::wasm::SExpressionWasmBuilder::SExpressionWasmBuilder
            (local_760,(Module *)local_500,pEVar2,Normal);
  ::wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder(local_760);
  if (builder._M_t.
      super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
      .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._7_1_ == 0) {
    bVar1 = ::wasm::WasmValidator::validate
                      ((Module *)&wasm.tagsMap._M_h._M_single_bucket,(uint)local_500);
    builder._M_t.
    super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
    .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._7_1_ = bVar1 ^ 1;
  }
  if ((builder._M_t.
       super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
       .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._7_1_ == 0) &&
     (extraout_RDX == ASSERT_UNLINKABLE.super_IString.str._M_str)) {
    reportUnknownImport.this =
         (Shell *)((long)&builder._M_t.
                          super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                          .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl
                  + 7);
    visitor.invalid = (bool *)&ASSERT_UNLINKABLE;
    visitor.this = reportUnknownImport.this;
    pNVar3 = &ASSERT_UNLINKABLE;
    wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)this;
    ::wasm::ModuleUtils::
    iterImportedGlobals<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_1_>
              ((ModuleUtils *)local_500,(Module *)this,visitor);
    visitor_00.invalid = (bool *)pNVar3;
    visitor_00.this = reportUnknownImport.this;
    ::wasm::ModuleUtils::
    iterImportedTables<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_1_>
              ((ModuleUtils *)local_500,(Module *)wasm.tagsMap._M_h._M_single_bucket,visitor_00);
    ::wasm::ModuleUtils::
    iterImportedFunctions<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_2_>
              ((Module *)local_500,(anon_class_8_1_d0a1351b)&wasm.tagsMap._M_h._M_single_bucket);
    visitor_01.invalid = (bool *)pNVar3;
    visitor_01.wasm =
         (Module *)
         ((long)&builder._M_t.
                 super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                 .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl + 7);
    ::wasm::ElementUtils::
    iterAllElementFunctionNames<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Name)_1_>
              ((ElementUtils *)local_500,(Module *)local_500,visitor_01);
    visitor_02.invalid = (bool *)pNVar3;
    visitor_02.this = reportUnknownImport.this;
    ::wasm::ModuleUtils::
    iterImportedMemories<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_1_>
              ((ModuleUtils *)local_500,(Module *)wasm.tagsMap._M_h._M_single_bucket,visitor_02);
  }
  if (((builder._M_t.
        super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
        .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._7_1_ & 1) == 0)
     && (extraout_RDX == ASSERT_TRAP.super_IString.str._M_str)) {
    instantiate(this,(Module *)local_500);
  }
  if (builder._M_t.
      super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
      .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._7_1_ != 0) {
    std::
    unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>::
    ~unique_ptr((unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                 *)&local_30);
    ::wasm::Module::~Module((Module *)local_500);
    return;
  }
  Colors::red((ostream *)&std::cerr);
  std::operator<<((ostream *)&std::cerr,"[should have been invalid]\n");
  Colors::normal((ostream *)&std::cerr);
  ::wasm::Fatal::Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
  std::ostream::_M_insert<void_const*>(&reportUnknownImport.invalid);
  builder._M_t.
  super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>._M_head_impl._6_1_ = 10;
  ::wasm::Fatal::operator<<
            ((Fatal *)&wasm.tagsMap._M_h._M_single_bucket,
             (char *)((long)&builder._M_t.
                             super___uniq_ptr_impl<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::SExpressionWasmBuilder_*,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                             .super__Head_base<0UL,_wasm::SExpressionWasmBuilder_*,_false>.
                             _M_head_impl + 6));
  ::wasm::Fatal::~Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
}

Assistant:

void parseModuleAssertion(Element& s) {
    Module wasm;
    wasm.features = FeatureSet::All;
    std::unique_ptr<SExpressionWasmBuilder> builder;
    auto id = s[0]->str();

    bool invalid = false;
    try {
      SExpressionWasmBuilder(wasm, *s[1], IRProfile::Normal);
    } catch (const ParseException&) {
      invalid = true;
    }

    if (!invalid) {
      // maybe parsed ok, but otherwise incorrect
      invalid = !WasmValidator().validate(wasm);
    }

    if (!invalid && id == ASSERT_UNLINKABLE) {
      // validate "instantiating" the mdoule
      auto reportUnknownImport = [&](Importable* import) {
        auto it = linkedInstances.find(import->module);
        if (it == linkedInstances.end() ||
            it->second->wasm.getExportOrNull(import->base) == nullptr) {
          std::cerr << "unknown import: " << import->module << '.'
                    << import->base << '\n';
          invalid = true;
        }
      };
      ModuleUtils::iterImportedGlobals(wasm, reportUnknownImport);
      ModuleUtils::iterImportedTables(wasm, reportUnknownImport);
      ModuleUtils::iterImportedFunctions(wasm, [&](Importable* import) {
        if (import->module == SPECTEST && import->base.startsWith(PRINT)) {
          // We can handle it.
        } else {
          reportUnknownImport(import);
        }
      });
      ElementUtils::iterAllElementFunctionNames(&wasm, [&](Name name) {
        // spec tests consider it illegal to use spectest.print in a table
        if (auto* import = wasm.getFunction(name)) {
          if (import->imported() && import->module == SPECTEST &&
              import->base.startsWith(PRINT)) {
            std::cerr << "cannot put spectest.print in table\n";
            invalid = true;
          }
        }
      });
      ModuleUtils::iterImportedMemories(wasm, reportUnknownImport);
    }

    if (!invalid && id == ASSERT_TRAP) {
      try {
        instantiate(&wasm);
      } catch (const TrapException&) {
        invalid = true;
      } catch (const WasmException& e) {
        std::cout << "[exception thrown: " << e << "]" << std::endl;
        invalid = true;
      }
    }

    if (!invalid) {
      Colors::red(std::cerr);
      std::cerr << "[should have been invalid]\n";
      Colors::normal(std::cerr);
      Fatal() << &wasm << '\n';
    }
  }